

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall
QColumnView::currentChanged(QColumnView *this,QModelIndex *current,QModelIndex *previous)

{
  QColumnViewPrivate *this_00;
  bool bVar1;
  char cVar2;
  QAbstractItemModel *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QColumnViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar1 = QModelIndex::isValid(current);
  if (bVar1) {
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent((QModelIndex *)&local_58,current);
    QModelIndex::parent(&local_70,previous);
    if (((((int)local_58 == local_70.r) && (local_58._4_4_ == local_70.c)) &&
        (puStack_50 == (undefined1 *)local_70.i)) && (local_48.ptr == local_70.m.ptr)) {
      pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
      cVar2 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,current);
      if (cVar2 != '\0') {
        pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
        cVar2 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,previous);
        if (cVar2 != '\0') {
          for (uVar4 = 0; uVar4 < (ulong)(this_00->columns).d.size; uVar4 = uVar4 + 1) {
            QAbstractItemView::rootIndex
                      (&local_70,(QAbstractItemView *)(this_00->columns).d.ptr[uVar4]);
            if ((((int)local_58 == local_70.r) && (local_58._4_4_ == local_70.c)) &&
               ((puStack_50 == (undefined1 *)local_70.i && (local_48.ptr == local_70.m.ptr)))) {
              if ((ulong)((int)uVar4 + 1) < (ulong)(this_00->columns).d.size) goto LAB_0050b977;
              break;
            }
          }
        }
      }
    }
    bVar1 = ::comparesEqual((QModelIndex *)&local_58,previous);
    if (bVar1) {
      for (uVar4 = 0; uVar4 < (ulong)(this_00->columns).d.size; uVar4 = uVar4 + 1) {
        QAbstractItemView::rootIndex(&local_70,(QAbstractItemView *)(this_00->columns).d.ptr[uVar4])
        ;
        if ((((int)local_58 == local_70.r) && (local_58._4_4_ == local_70.c)) &&
           ((puStack_50 == (undefined1 *)local_70.i && (local_48.ptr == local_70.m.ptr)))) {
          if ((ulong)(this_00->columns).d.size < (ulong)((int)uVar4 + 2)) {
            QColumnViewPrivate::createColumn(this_00,current,false);
          }
          goto LAB_0050b951;
        }
      }
    }
    QColumnViewPrivate::closeColumns(this_00,current,true);
LAB_0050b951:
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
    cVar2 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,current);
    if (cVar2 == '\0') {
      updatePreviewWidget(this,current);
    }
LAB_0050b977:
    QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QColumnView);
    if (!current.isValid()) {
        QAbstractItemView::currentChanged(current, previous);
        return;
    }

    QModelIndex currentParent = current.parent();
    // optimize for just moving up/down in a list where the child view doesn't change
    if (currentParent == previous.parent()
            && model()->hasChildren(current) && model()->hasChildren(previous)) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                if (d->columns.size() > i + 1) {
                    QAbstractItemView::currentChanged(current, previous);
                    return;
                }
                break;
            }
        }
    }

    // Scrolling to the right we need to have an empty spot
    bool found = false;
    if (currentParent == previous) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                found = true;
                if (d->columns.size() < i + 2) {
                    d->createColumn(current, false);
                }
                break;
            }
        }
    }
    if (!found)
        d->closeColumns(current, true);

    if (!model()->hasChildren(current))
        emit updatePreviewWidget(current);

    QAbstractItemView::currentChanged(current, previous);
}